

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall helics::BrokerBase::writeProfilingData(BrokerBase *this)

{
  bool bVar1;
  long in_RDI;
  failure *anon_var_0;
  ProfilerBuffer *in_stack_00000230;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x278));
  if (bVar1) {
    CLI::std::__shared_ptr_access<helics::ProfilerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::ProfilerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x508f49);
    ProfilerBuffer::writeFile(in_stack_00000230);
  }
  return;
}

Assistant:

void BrokerBase::writeProfilingData()
{
    if (prBuff) {
        try {
            prBuff->writeFile();
        }
        catch (const std::ios_base::failure&) {
            sendToLogger(parent_broker_id,
                         LogLevels::ERROR_LEVEL,
                         identifier,
                         "Unable to write profiling buffer data");
        }
    }
}